

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients_vec<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)0> *div)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m512i numers_00;
  __m512i sumX4_00;
  undefined1 (*pauVar3) [64];
  uint64_t uVar4;
  uint *in_RSI;
  random_numerators<unsigned_int> *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  __m512i numers;
  const_iterator iter;
  __m512i sumX4;
  size_t count;
  __m512i t;
  uint32_t shift;
  __m512i q;
  uint8_t more;
  __m512i hi_product_Z1Z3;
  __m512i mask;
  __m512i a1X3X;
  __m512i hi_product_0Z2Z;
  undefined8 in_stack_fffffffffffff280;
  random_numerators<unsigned_int> *in_stack_fffffffffffff288;
  undefined1 in_stack_fffffffffffff290 [40];
  undefined1 (*pauVar9) [64];
  undefined1 auVar10 [56];
  undefined1 (*local_cc8) [64];
  undefined1 local_cc0 [64];
  size_t local_c58;
  uint *local_c50;
  undefined1 local_c40 [64];
  undefined1 (*local_bd0) [64];
  uint *local_bc8;
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  uint *local_b08;
  undefined1 local_b00 [64];
  uint *local_a88;
  undefined1 local_a80 [64];
  uint local_a04;
  undefined1 local_a00 [64];
  byte local_989;
  uint *local_988;
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  uint local_8c4;
  undefined1 local_8c0 [64];
  undefined4 local_844;
  undefined1 local_840 [64];
  uint local_7c4;
  undefined1 local_7c0 [64];
  uint local_744;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  uint local_504;
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined4 local_3c4;
  undefined1 local_3c0 [64];
  undefined4 local_344;
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_c58 = 0x10;
  local_c40 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar5 = vmovdqa64_avx512f(local_c40);
  local_cc0 = vmovdqa64_avx512f(auVar5);
  local_c50 = in_RSI;
  local_cc8 = (undefined1 (*) [64])random_numerators<unsigned_int>::begin(in_RDI);
  while( true ) {
    pauVar9 = local_cc8;
    pauVar3 = (undefined1 (*) [64])random_numerators<unsigned_int>::end(in_stack_fffffffffffff288);
    if (pauVar9 == pauVar3) break;
    local_bd0 = local_cc8;
    auVar5 = vmovdqa64_avx512f(*local_cc8);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    local_bc0 = vmovdqa64_avx512f(auVar5);
    local_bc8 = local_c50;
    auVar5 = vmovdqa64_avx512f(local_bc0);
    local_b08 = local_c50;
    local_b80 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(local_b80);
    local_a88 = local_c50;
    local_b00 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(local_b00);
    local_980 = vmovdqa64_avx512f(auVar5);
    local_988 = local_c50;
    local_989 = (byte)local_c50[1];
    if (*local_c50 == 0) {
      auVar5 = vmovdqa64_avx512f(local_980);
      local_740 = vmovdqa64_avx512f(auVar5);
      local_744 = (uint)local_989;
      auVar5 = vmovdqa64_avx512f(local_740);
      auVar5 = vpsrld_avx512f(auVar5,ZEXT416(local_744));
      local_940 = vmovdqa64_avx512f(auVar5);
    }
    else {
      auVar5 = vmovdqa64_avx512f(local_980);
      local_504 = *local_c50;
      auVar7 = vpbroadcastd_avx512f(ZEXT416(local_504));
      local_580 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(local_580);
      local_5c0 = vmovdqa64_avx512f(auVar5);
      local_600 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(local_5c0);
      auVar7 = vmovdqa64_avx512f(local_600);
      local_240 = vmovdqa64_avx512f(auVar5);
      local_280 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(local_240);
      auVar7 = vmovdqa64_avx512f(local_280);
      auVar5 = vpmuludq_avx512f(auVar5,auVar7);
      local_340 = vmovdqa64_avx512f(auVar5);
      local_344 = 0x20;
      auVar5 = vmovdqa64_avx512f(local_340);
      auVar5 = vpsrlq_avx512f(auVar5,ZEXT416(0x20));
      local_640 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_5c0);
      local_3c0 = vmovdqa64_avx512f(auVar5);
      local_3c4 = 0x20;
      auVar5 = vmovdqa64_avx512f(local_3c0);
      auVar5 = vpsrlq_avx512f(auVar5,ZEXT416(0x20));
      local_680 = vmovdqa64_avx512f(auVar5);
      local_184 = 0xffffffff;
      local_188 = 0;
      local_18c = 0xffffffff;
      local_190 = 0;
      local_194 = 0xffffffff;
      local_198 = 0;
      local_19c = 0xffffffff;
      local_1a0 = 0;
      local_1a4 = 0xffffffff;
      local_1a8 = 0;
      local_1ac = 0xffffffff;
      local_1b0 = 0;
      local_1b4 = 0xffffffff;
      local_1b8 = 0;
      local_1bc = 0xffffffff;
      local_1c0 = 0;
      auVar1 = vpinsrd_avx(ZEXT416(0),0xffffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0,2);
      auVar1 = vpinsrd_avx(auVar1,0xffffffff,3);
      auVar2 = vpinsrd_avx(ZEXT416(0),0xffffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0,2);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
      auVar8._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar8._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrd_avx(ZEXT416(0),0xffffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0,2);
      auVar1 = vpinsrd_avx(auVar1,0xffffffff,3);
      auVar2 = vpinsrd_avx(ZEXT416(0),0xffffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0,2);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
      auVar5 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                              ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2)),auVar8,1);
      local_200 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_200);
      local_6c0 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_680);
      auVar7 = vmovdqa64_avx512f(local_600);
      local_2c0 = vmovdqa64_avx512f(auVar5);
      local_300 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(local_2c0);
      auVar7 = vmovdqa64_avx512f(local_300);
      auVar6 = vpbroadcastq_avx512f(ZEXT816(0xffffffff));
      auVar5 = vpandd_avx512f(auVar5,auVar6);
      auVar7 = vpandd_avx512f(auVar7,auVar6);
      auVar5 = vpmullq_avx512dq(auVar5,auVar7);
      auVar7 = vmovdqa64_avx512f(local_6c0);
      local_140 = vmovdqa64_avx512f(auVar5);
      local_180 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(local_140);
      auVar5 = vpandq_avx512f(auVar5,local_180);
      local_700 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(local_640);
      auVar7 = vmovdqa64_avx512f(local_700);
      local_c0 = vmovdqa64_avx512f(auVar5);
      local_100 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(local_c0);
      auVar5 = vporq_avx512f(auVar5,local_100);
      local_a00 = vmovdqa64_avx512f(auVar5);
      if ((local_989 & 0x40) == 0) {
        auVar5 = vmovdqa64_avx512f(local_a00);
        local_7c0 = vmovdqa64_avx512f(auVar5);
        local_7c4 = (uint)local_989;
        auVar5 = vmovdqa64_avx512f(local_7c0);
        auVar5 = vpsrld_avx512f(auVar5,ZEXT416(local_7c4));
        local_940 = vmovdqa64_avx512f(auVar5);
      }
      else {
        local_a04 = local_989 & 0x1f;
        auVar5 = vmovdqa64_avx512f(local_980);
        auVar7 = vmovdqa64_avx512f(local_a00);
        local_440 = vmovdqa64_avx512f(auVar5);
        local_480 = vmovdqa64_avx512f(auVar7);
        auVar5 = vmovdqa64_avx512f(local_440);
        auVar7 = vmovdqa64_avx512f(local_480);
        auVar5 = vpsubd_avx512f(auVar5,auVar7);
        local_840 = vmovdqa64_avx512f(auVar5);
        local_844 = 1;
        auVar5 = vmovdqa64_avx512f(local_840);
        auVar5 = vpsrld_avx512f(auVar5,ZEXT416(1));
        auVar7 = vmovdqa64_avx512f(local_a00);
        local_4c0 = vmovdqa64_avx512f(auVar5);
        local_500 = vmovdqa64_avx512f(auVar7);
        auVar5 = vmovdqa64_avx512f(local_4c0);
        auVar7 = vmovdqa64_avx512f(local_500);
        auVar5 = vpaddd_avx512f(auVar5,auVar7);
        local_a80 = vmovdqa64_avx512f(auVar5);
        auVar5 = vmovdqa64_avx512f(local_a80);
        local_8c0 = vmovdqa64_avx512f(auVar5);
        auVar5 = vmovdqa64_avx512f(local_8c0);
        auVar5 = vpsrld_avx512f(auVar5,ZEXT416(local_a04));
        local_940 = vmovdqa64_avx512f(auVar5);
        local_8c4 = local_a04;
      }
    }
    auVar5 = vmovdqa64_avx512f(local_940);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar10 = auVar5._0_56_;
    auVar7 = vmovdqa64_avx512f(local_cc0);
    vmovdqa64_avx512f(auVar5);
    sumX4_00[1] = auVar10._0_8_;
    sumX4_00[2] = auVar10._8_8_;
    sumX4_00[3] = auVar10._16_8_;
    sumX4_00[4] = auVar10._24_8_;
    sumX4_00[5] = auVar10._32_8_;
    sumX4_00[6] = auVar10._40_8_;
    sumX4_00[7] = auVar10._48_8_;
    sumX4_00[0] = (longlong)pauVar9;
    numers_00[1] = in_stack_fffffffffffff280;
    numers_00[0] = 0x109637;
    numers_00[2] = (longlong)in_stack_fffffffffffff288;
    numers_00[3] = in_stack_fffffffffffff290._0_8_;
    numers_00[4] = in_stack_fffffffffffff290._8_8_;
    numers_00[5] = in_stack_fffffffffffff290._16_8_;
    numers_00[6] = in_stack_fffffffffffff290._24_8_;
    numers_00[7] = in_stack_fffffffffffff290._32_8_;
    add_vector<4ul>(sumX4_00,numers_00);
    local_cc0 = vmovdqa64_avx512f(auVar7);
    local_cc8 = (undefined1 (*) [64])(*local_cc8 + local_c58 * 4);
  }
  uVar4 = unsigned_sum_vals<unsigned_int>((uint *)local_cc0,local_c58);
  return uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}